

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase71::run(TestCase71 *this)

{
  uint uVar1;
  void **ppvVar2;
  StringPtr *pSVar3;
  RemoveConst<kj::StringPtr> *pRVar4;
  StringPtr *pSVar5;
  HashBucket *pHVar6;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> TVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  Exception *pEVar14;
  HashBucket *pHVar15;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 params;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  char (*extraout_RDX_00) [6];
  char (*extraout_RDX_01) [6];
  char (*extraout_RDX_02) [6];
  char (*params_00) [6];
  char (*params_01) [6];
  ulong newSize;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *pTVar16;
  size_t sVar17;
  uint uVar18;
  HashBucket *_s944_1;
  HashBucket *pHVar19;
  HashBucket *_s944;
  HashBucket HVar20;
  ulong uVar21;
  bool bVar22;
  Maybe<unsigned_long> MVar23;
  ArrayPtr<kj::StringPtr> table_00;
  ArrayPtr<const_unsigned_char> s;
  ArrayPtr<const_unsigned_char> s_00;
  DebugExpression<bool> _kjCondition_31;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> table;
  size_t pos;
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition;
  StringPtr STRS [3];
  char searchWaldo [7];
  char insertWaldo [7];
  HashBucket local_5e0;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> local_5d8;
  undefined1 local_588 [32];
  undefined1 local_568 [8];
  undefined1 auStack_560 [24];
  char *local_548;
  Exception *local_3c8;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *local_3c0;
  long local_3b8;
  Fault local_3b0;
  StringPtr local_3a8;
  char *local_398;
  undefined8 uStack_390;
  char *local_388;
  undefined8 uStack_380;
  undefined1 local_378 [416];
  String local_1d8 [17];
  StringPtr local_40;
  
  local_5d8.rows.builder.ptr = (StringPtr *)0x0;
  local_5d8.rows.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_5d8.rows.builder.endPtr = (StringPtr *)0x0;
  local_5d8.rows.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_5d8.indexes.erasedCount = 0;
  local_5d8.indexes.buckets.ptr = (HashBucket *)0x0;
  local_5d8.indexes.buckets.size_ = 0;
  local_5d8.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  if (((StringPtr *)local_378._0_8_ != (StringPtr *)0x0) && (Debug::minSeverity < 3)) {
    local_548._0_1_ = (StringPtr *)local_378._0_8_ == (StringPtr *)0x0;
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4a,ERROR,
               "\"failed: expected \" \"table.find(\\\"foo\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"foo\") == kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  local_568 = (undefined1  [8])
              ((long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >> 4);
  auStack_560._0_8_ = auStack_560._0_8_ & 0xffffffff00000000;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,
                               local_5d8.rows.builder.pos == local_5d8.rows.builder.ptr);
  if ((local_5d8.rows.builder.pos != local_5d8.rows.builder.ptr) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4c,ERROR,"\"failed: expected \" \"table.size() == 0\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 0",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  local_378._0_8_ = "foo";
  local_378._8_8_ = (StringPtr *)0x4;
  local_1d8[0].content.ptr =
       (char *)Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               insert(&local_5d8,(StringPtr *)local_378);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1e9f8d);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4d,ERROR,
               "\"failed: expected \" \"table.insert(\\\"foo\\\") == \\\"foo\\\"\", _kjCondition",
               (char (*) [46])"failed: expected table.insert(\"foo\") == \"foo\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_568 = (undefined1  [8])(lVar13 >> 4);
  auStack_560._0_4_ = 1;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x10);
  if ((lVar13 != 0x10) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4e,ERROR,"\"failed: expected \" \"table.size() == 1\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 1",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  local_378._0_8_ = "bar";
  local_378._8_8_ = (StringPtr *)0x4;
  local_1d8[0].content.ptr =
       (char *)Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               insert(&local_5d8,(StringPtr *)local_378);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ddb05);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x4f,ERROR,
               "\"failed: expected \" \"table.insert(\\\"bar\\\") == \\\"bar\\\"\", _kjCondition",
               (char (*) [46])"failed: expected table.insert(\"bar\") == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_568 = (undefined1  [8])(lVar13 >> 4);
  auStack_560._0_4_ = 2;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x20);
  if ((lVar13 != 0x20) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x50,ERROR,"\"failed: expected \" \"table.size() == 2\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 2",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  if ((StringPtr *)local_378._0_8_ == (StringPtr *)0x0) {
    local_3a8.content.ptr = (char *)0x0;
    local_378._0_8_ = (StringPtr *)0x0;
    local_378._8_8_ = (StringPtr *)0x0;
    Debug::Fault::init((Fault *)&local_3a8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)&local_3a8);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1e9f8d);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x52,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"foo\\\")) == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"foo\")) == \"foo\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  if ((StringPtr *)local_378._0_8_ == (StringPtr *)0x0) {
    local_3a8.content.ptr = (char *)0x0;
    local_378._0_8_ = (StringPtr *)0x0;
    local_378._8_8_ = (StringPtr *)0x0;
    Debug::Fault::init((Fault *)&local_3a8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)&local_3a8);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ddb05);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x53,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"bar\\\")) == \\\"bar\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"bar\")) == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  bVar22 = (StringPtr *)local_378._0_8_ == (StringPtr *)0x0;
  local_548._0_1_ = bVar22;
  if ((!bVar22) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x54,ERROR,
               "\"failed: expected \" \"table.find(\\\"fop\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"fop\") == kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,(StringPtr *)local_378._0_8_ == (StringPtr *)0x0);
  if (((StringPtr *)local_378._0_8_ != (StringPtr *)0x0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x55,ERROR,
               "\"failed: expected \" \"table.find(\\\"baq\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"baq\") == kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  local_568 = (undefined1  [8])0x1ed8ad;
  auStack_560._0_8_ = (None *)0x4;
  pEVar14 = (Exception *)
            Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
                      (&local_5d8,(StringPtr *)local_568);
  local_378._0_8_ = pEVar14;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_378,(char (*) [7])0x1ed8ad);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[30],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x59,ERROR,"\"failed: expected \" \"ref == \\\"baz\\\"\", _kjCondition",
               (char (*) [30])"failed: expected ref == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_568,(char (*) [7])&local_5d8);
  if (local_568 == (undefined1  [8])0x0) {
    local_378._0_8_ = (StringPtr *)0x0;
    local_568 = (undefined1  [8])0x0;
    auStack_560._0_8_ = (None *)0x0;
    Debug::Fault::init((Fault *)local_378,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)local_378);
  }
  auStack_560._0_8_ = local_568;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  bVar22 = (undefined1  [8])pEVar14 == local_568;
  if ((!bVar22) && (Debug::minSeverity < 3)) {
    local_568 = (undefined1  [8])pEVar14;
    local_548._0_1_ = bVar22;
    Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x5b,ERROR,"\"failed: expected \" \"&ref == &ref2\", _kjCondition",
               (char (*) [31])"failed: expected &ref == &ref2",
               (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_568);
  }
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_568 = (undefined1  [8])(lVar13 >> 4);
  auStack_560._0_4_ = 3;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x30);
  if ((lVar13 != 0x30) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x5e,ERROR,"\"failed: expected \" \"table.size() == 3\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 3",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  local_378._0_8_ = (long)local_5d8.rows.builder.ptr + 0x10;
  local_1d8[0].content.ptr = (char *)local_5d8.rows.builder.ptr;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1e9f8d);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x62,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"foo\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"foo\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  local_378._0_8_ =
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
       (local_378._0_8_ + 0x10);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ddb05);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x63,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"bar\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  local_378._0_8_ = local_378._0_8_ + 0x10;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ed8ad);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x64,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"baz\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  auStack_560._0_8_ = local_5d8.rows.builder.pos;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,
                               (RemoveConst<kj::StringPtr> *)local_378._0_8_ ==
                               local_5d8.rows.builder.pos);
  local_568 = (undefined1  [8])local_378;
  if (((RemoveConst<kj::StringPtr> *)local_378._0_8_ != local_5d8.rows.builder.pos) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x65,ERROR,"\"failed: expected \" \"iter == table.end()\", _kjCondition",
               (char (*) [37])"failed: expected iter == table.end()",
               (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_568);
  }
  table_00.size_ = (size_t)local_5d8.rows.builder.ptr;
  table_00.ptr = (StringPtr *)&local_5d8.indexes;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[4]>
            ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)local_568,table_00,
             (char (*) [7])0x1e9f8d);
  TVar7 = local_568[0];
  if (local_568[0] ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>)0x1) {
    Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
              (&local_5d8,auStack_560._0_8_);
  }
  local_378[0] = TVar7;
  if ((TVar7 == (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>)0x0)
     && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x68,ERROR,
               "\"failed: expected \" \"table.eraseMatch(\\\"foo\\\")\", _kjCondition",
               (char (*) [41])"failed: expected table.eraseMatch(\"foo\")",
               (DebugExpression<bool> *)local_378);
  }
  local_568 = (undefined1  [8])
              ((long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >> 4);
  auStack_560._0_4_ = 2;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  bVar22 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr == 0x20;
  local_548._0_1_ = bVar22;
  if ((!bVar22) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x69,ERROR,"\"failed: expected \" \"table.size() == 2\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 2",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,(StringPtr *)local_378._0_8_ == (StringPtr *)0x0);
  if (((StringPtr *)local_378._0_8_ != (StringPtr *)0x0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x6a,ERROR,
               "\"failed: expected \" \"table.find(\\\"foo\\\") == kj::none\", _kjCondition",
               (char (*) [47])"failed: expected table.find(\"foo\") == kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  if ((StringPtr *)local_378._0_8_ == (StringPtr *)0x0) {
    local_3a8.content.ptr = (char *)0x0;
    local_378._0_8_ = (StringPtr *)0x0;
    local_378._8_8_ = (StringPtr *)0x0;
    Debug::Fault::init((Fault *)&local_3a8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)&local_3a8);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ddb05);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x6b,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"bar\\\")) == \\\"bar\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"bar\")) == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  if ((StringPtr *)local_378._0_8_ == (StringPtr *)0x0) {
    local_3a8.content.ptr = (char *)0x0;
    local_378._0_8_ = (StringPtr *)0x0;
    local_378._8_8_ = (StringPtr *)0x0;
    Debug::Fault::init((Fault *)&local_3a8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)&local_3a8);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ed8ad);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x6c,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"baz\\\")) == \\\"baz\\\"\", _kjCondition"
               ,(char (*) [63])"failed: expected KJ_ASSERT_NONNULL(table.find(\"baz\")) == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  local_378._0_8_ = (long)local_5d8.rows.builder.ptr + 0x10;
  local_1d8[0].content.ptr = (char *)local_5d8.rows.builder.ptr;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ed8ad);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x70,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"baz\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"baz\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  local_378._0_8_ = local_378._0_8_ + 0x10;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])0x1ddb05);
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x71,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"bar\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"bar\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  auStack_560._0_8_ = local_5d8.rows.builder.pos;
  auStack_560._8_8_ = " == ";
  bVar22 = (RemoveConst<kj::StringPtr> *)local_378._0_8_ == local_5d8.rows.builder.pos;
  auStack_560._16_8_ = &DAT_00000005;
  local_568 = (undefined1  [8])local_378;
  local_548._0_1_ = bVar22;
  if ((!bVar22) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x72,ERROR,"\"failed: expected \" \"iter == table.end()\", _kjCondition",
               (char (*) [37])"failed: expected iter == table.end()",
               (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_568);
  }
  local_378._0_8_ = "qux";
  local_378._8_8_ = (Exception *)0x4;
  MVar23 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
           Impl<0UL,_false>::insert
                     ((Impl<0UL,_false> *)local_568,&local_5d8,
                      (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >> 4,
                      (StringPtr *)local_378,0xffffffff);
  params = MVar23.ptr.field_1;
  if (local_568[0] ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>)0x1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x77,FAILED,(char *)0x0,"\"shouldn\'t get here\"",
               (char (*) [19])"shouldn\'t get here");
    Debug::Fault::fatal((Fault *)local_568);
  }
  if (local_5d8.rows.builder.pos == local_5d8.rows.builder.endPtr) {
    sVar17 = 4;
    if (local_5d8.rows.builder.endPtr != local_5d8.rows.builder.ptr) {
      sVar17 = (long)local_5d8.rows.builder.endPtr - (long)local_5d8.rows.builder.ptr >> 3;
    }
    Vector<kj::StringPtr>::setCapacity(&local_5d8.rows,sVar17);
    params = extraout_RDX;
  }
  pRVar4 = local_5d8.rows.builder.pos;
  *(undefined8 *)local_5d8.rows.builder.pos = local_378._0_8_;
  *(undefined8 *)((long)local_5d8.rows.builder.pos + 8) = local_378._8_8_;
  local_5d8.rows.builder.pos =
       (RemoveConst<kj::StringPtr> *)((long)local_5d8.rows.builder.pos + 0x10);
  str<char_const(&)[4]>((String *)local_378,(kj *)"qux",(char (*) [4])params);
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  if ((Exception *)local_378._8_8_ == (Exception *)0x0) {
    local_1d8[0].content.ptr = (char *)(Exception *)0x1f73e6;
  }
  local_1d8[0].content.size_ =
       (long)(local_378._8_8_ + 0x68) +
       ((ulong)((Exception *)local_378._8_8_ == (Exception *)0x0) - 0x68);
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::Impl<0UL,_false>
  ::insert((Impl<0UL,_false> *)local_568,&local_5d8,
           (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >> 4,
           (StringPtr *)local_1d8,0xffffffff);
  if (local_568[0] ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>)0x1) {
    lVar13 = auStack_560._0_8_ * 0x10;
    auStack_560._0_8_ = local_378._8_8_;
    if ((Exception *)local_378._8_8_ != (Exception *)0x0) {
      auStack_560._0_8_ = local_378._0_8_;
    }
    HVar20 = (HashBucket)(lVar13 + (long)local_5d8.rows.builder.ptr);
    local_568 = (undefined1  [8])local_1d8[0].content.ptr;
    auStack_560._8_8_ = " == ";
    auStack_560._16_8_ = &DAT_00000005;
    local_548._0_1_ = local_1d8[0].content.ptr == (char *)auStack_560._0_8_;
    if ((!(bool)local_548._0_1_) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[47],kj::_::DebugComparison<char_const*,char*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x7c,ERROR,
                 "\"failed: expected \" \"param.begin() == copy.begin()\", _kjCondition",
                 (char (*) [47])"failed: expected param.begin() == copy.begin()",
                 (DebugComparison<const_char_*,_char_*> *)local_568);
    }
    auStack_560._0_8_ = pRVar4;
    auStack_560._8_8_ = " == ";
    auStack_560._16_8_ = &DAT_00000005;
    local_548._0_1_ = (HashBucket)pRVar4 == HVar20;
    local_568 = (undefined1  [8])HVar20;
    if ((!(bool)local_548._0_1_) && (Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x7d,ERROR,"\"failed: expected \" \"&existing == &row\", _kjCondition",
                 (char (*) [35])"failed: expected &existing == &row",
                 (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_568);
    }
  }
  else {
    if (local_5d8.rows.builder.pos == local_5d8.rows.builder.endPtr) {
      sVar17 = 4;
      if (local_5d8.rows.builder.endPtr != local_5d8.rows.builder.ptr) {
        sVar17 = (long)local_5d8.rows.builder.endPtr - (long)local_5d8.rows.builder.ptr >> 3;
      }
      Vector<kj::StringPtr>::setCapacity(&local_5d8.rows,sVar17);
    }
    *(char **)local_5d8.rows.builder.pos = local_1d8[0].content.ptr;
    *(size_t *)((long)local_5d8.rows.builder.pos + 8) = local_1d8[0].content.size_;
    local_5d8.rows.builder.pos =
         (RemoveConst<kj::StringPtr> *)((long)local_5d8.rows.builder.pos + 0x10);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_568,(char (*) [7])&local_5d8);
  if ((HashBucket)local_568 == (HashBucket)0x0) {
    local_1d8[0].content.ptr = (char *)0x0;
    local_568 = (undefined1  [8])0x0;
    auStack_560._0_8_ = (None *)0x0;
    Debug::Fault::init((Fault *)local_1d8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)local_1d8);
  }
  auStack_560._0_8_ = pRVar4;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,local_568 == (undefined1  [8])pRVar4);
  if ((local_568 != (undefined1  [8])pRVar4) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[32],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x81,ERROR,"\"failed: expected \" \"&found == &row\", _kjCondition",
               (char (*) [32])"failed: expected &found == &row",
               (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_568);
  }
  uVar9 = local_378._8_8_;
  uVar8 = local_378._0_8_;
  if ((None *)local_378._0_8_ != (None *)0x0) {
    local_378._0_8_ = (None *)0x0;
    local_378._8_8_ = (Exception *)0x0;
    (***(_func_int ***)local_378._16_8_)(local_378._16_8_,uVar8,1,uVar9,uVar9,0);
  }
  local_388 = "garply";
  uStack_380 = 7;
  local_398 = "grault";
  uStack_390 = 7;
  local_3a8.content.ptr = "corge";
  local_3a8.content.size_ = 6;
  uVar21 = ((long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >> 4) + 3;
  if ((ulong)((long)local_5d8.rows.builder.endPtr - (long)local_5d8.rows.builder.ptr >> 4) < uVar21)
  {
    newSize = 4;
    if (local_5d8.rows.builder.endPtr != local_5d8.rows.builder.ptr) {
      newSize = (long)local_5d8.rows.builder.endPtr - (long)local_5d8.rows.builder.ptr >> 3;
    }
    if (newSize < uVar21) {
      newSize = uVar21;
    }
    Vector<kj::StringPtr>::setCapacity(&local_5d8.rows,newSize);
  }
  if (local_5d8.indexes.buckets.size_ < uVar21 * 2) {
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&local_5d8.indexes,uVar21);
  }
  lVar13 = 0;
  do {
    Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
              (&local_5d8,(StringPtr *)((long)&local_3a8.content.ptr + lVar13));
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x30);
  local_568 = (undefined1  [8])
              ((long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >> 4);
  auStack_560._0_4_ = 6;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  bVar22 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr == 0x60;
  local_548._0_1_ = bVar22;
  if ((!bVar22) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x86,ERROR,"\"failed: expected \" \"table.size() == 6\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 6",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " != ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548._0_1_ = (None *)local_378._0_8_ != (None *)0x0;
  if ((!(bool)local_548._0_1_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x87,ERROR,
               "\"failed: expected \" \"table.find(\\\"corge\\\") != kj::none\", _kjCondition",
               (char (*) [49])"failed: expected table.find(\"corge\") != kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " != ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548._0_1_ = (None *)local_378._0_8_ != (None *)0x0;
  if ((!(bool)local_548._0_1_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x88,ERROR,
               "\"failed: expected \" \"table.find(\\\"grault\\\") != kj::none\", _kjCondition",
               (char (*) [50])"failed: expected table.find(\"grault\") != kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " != ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,(None *)local_378._0_8_ != (None *)0x0);
  if (((None *)local_378._0_8_ == (None *)0x0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x89,ERROR,
               "\"failed: expected \" \"table.find(\\\"garply\\\") != kj::none\", _kjCondition",
               (char (*) [50])"failed: expected table.find(\"garply\") != kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
  }
  local_40.content.ptr = "bar";
  local_40.content.size_ = 4;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
            (&local_5d8,&local_40);
  local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
  local_568 = (undefined1  [8])((ulong)local_568 & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x8b,ERROR,"\"code did not throw: \" \"table.insert(\\\"bar\\\")\"",
               (char (*) [40])"code did not throw: table.insert(\"bar\")");
  }
  if (local_568[0] ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>)0x1) {
    Exception::~Exception((Exception *)auStack_560);
  }
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_568 = (undefined1  [8])(lVar13 >> 4);
  auStack_560._0_4_ = 6;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x60);
  if ((lVar13 != 0x60) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x8d,ERROR,"\"failed: expected \" \"table.size() == 6\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 6",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  local_378._0_8_ = "baa";
  local_378._8_8_ = (StringPtr *)0x4;
  local_1d8[0].content.ptr =
       (char *)Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               insert(&local_5d8,(StringPtr *)local_378);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])"baa");
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x8f,ERROR,
               "\"failed: expected \" \"table.insert(\\\"baa\\\") == \\\"baa\\\"\", _kjCondition",
               (char (*) [46])"failed: expected table.insert(\"baa\") == \"baa\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  if (local_5d8.rows.builder.pos == local_5d8.rows.builder.ptr) {
    pEVar14 = (Exception *)0x0;
  }
  else {
    pEVar14 = (Exception *)0x0;
    uVar21 = 0;
    do {
      if ((*(long *)((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)((long)local_5d8.rows.builder.ptr + 8) + uVar21 * 0x10) - 1U < 2) ||
         (**(short **)((long)local_5d8.rows.builder.ptr + uVar21 * 0x10) != 0x6162)) {
        uVar21 = uVar21 + 1;
      }
      else {
        Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
                  (&local_5d8,uVar21);
        pEVar14 = (Exception *)((long)&(pEVar14->ownFile).content.ptr + 1);
      }
    } while (uVar21 < (ulong)((long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr >>
                             4));
  }
  auStack_560[0] = '\x03';
  auStack_560[1] = '\0';
  auStack_560[2] = '\0';
  auStack_560[3] = '\0';
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  if ((pEVar14 != (Exception *)0x3) && (Debug::minSeverity < 3)) {
    local_568 = (undefined1  [8])pEVar14;
    local_548._0_1_ = pEVar14 == (Exception *)0x3;
    Debug::log<char_const(&)[85],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x91,ERROR,
               "\"failed: expected \" \"table.eraseAll([](StringPtr s) { return s.startsWith(\\\"ba\\\"); }) == 3\", _kjCondition"
               ,(char (*) [85])
                "failed: expected table.eraseAll([](StringPtr s) { return s.startsWith(\"ba\"); }) == 3"
               ,(DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_568 = (undefined1  [8])(lVar13 >> 4);
  auStack_560._0_4_ = 4;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x40);
  if ((lVar13 != 0x40) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x92,ERROR,"\"failed: expected \" \"table.size() == 4\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 4",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
  }
  local_378._0_8_ = (long)local_5d8.rows.builder.ptr + 0x10;
  local_1d8[0].content.ptr = (char *)local_5d8.rows.builder.ptr;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])"garply");
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x96,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"garply\\\"\", _kjCondition",
               (char (*) [37])"failed: expected *iter++ == \"garply\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  local_378._0_8_ =
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
       (local_378._0_8_ + 0x10);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])"grault");
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x97,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"grault\\\"\", _kjCondition",
               (char (*) [37])"failed: expected *iter++ == \"grault\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  local_378._0_8_ =
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
       (local_378._0_8_ + 0x10);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])"qux");
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x98,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"qux\\\"\", _kjCondition",
               (char (*) [34])"failed: expected *iter++ == \"qux\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
  }
  local_1d8[0].content.ptr = (char *)local_378._0_8_;
  local_378._0_8_ = local_378._0_8_ + 0x10;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568,
             (DebugExpression<kj::StringPtr&> *)local_1d8,(char (*) [7])"corge");
  if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x99,ERROR,
               "\"failed: expected \" \"*iter++ == \\\"corge\\\"\", _kjCondition",
               (char (*) [36])"failed: expected *iter++ == \"corge\"",
               (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568);
  }
  auStack_560._0_8_ = local_5d8.rows.builder.pos;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,
                               (RemoveConst<kj::StringPtr> *)local_378._0_8_ ==
                               local_5d8.rows.builder.pos);
  local_568 = (undefined1  [8])local_378;
  if (((RemoveConst<kj::StringPtr> *)local_378._0_8_ != local_5d8.rows.builder.pos) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0x9a,ERROR,"\"failed: expected \" \"iter == table.end()\", _kjCondition",
               (char (*) [37])"failed: expected iter == table.end()",
               (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_568);
  }
  pEVar14 = *(Exception **)((long)local_5d8.rows.builder.ptr + 0x10);
  local_588._24_8_ = local_5d8.rows.builder.ptr;
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_588._0_8_ = lVar13 >> 4;
  if (local_5d8.indexes.buckets.size_ * 2 <
      (local_5d8.indexes.erasedCount + local_588._0_8_) * 3 + 3) {
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash
              (&local_5d8.indexes,local_588._0_8_ * 3 + 3);
  }
  s.size_ = 6;
  s.ptr = (uchar *)"grault";
  uVar11 = HashCoder::operator*((HashCoder *)&HASHCODER,s);
  sVar17 = local_5d8.indexes.buckets.size_;
  pHVar6 = local_5d8.indexes.buckets.ptr;
  local_3c0 = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
              (local_588._24_8_ + 0x10);
  uVar18 = (int)local_5d8.indexes.buckets.size_ - 1U & uVar11;
  pHVar19 = (HashBucket *)0x0;
  HVar20 = (HashBucket)local_588._24_8_;
  local_3c8 = pEVar14;
  local_3b8 = lVar13;
LAB_00159523:
  pHVar15 = pHVar6 + uVar18;
  uVar1 = pHVar15->value;
  uVar21 = (ulong)uVar1;
  if (uVar1 == 1) {
    if (pHVar19 == (HashBucket *)0x0) {
      pHVar19 = pHVar15;
    }
  }
  else {
    if (uVar1 == 0) {
      if (pHVar19 != (HashBucket *)0x0) {
        local_5d8.indexes.erasedCount = local_5d8.indexes.erasedCount - 1;
        pHVar15 = pHVar19;
      }
      *pHVar15 = (HashBucket)((ulong)uVar11 + local_3b8 * 0x10000000 + 0x200000000);
      bVar22 = false;
      goto LAB_001595bd;
    }
    if (pHVar15->hash == uVar11) {
      uVar21 = (ulong)(uVar1 - 2);
      if ((*(long *)((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)((long)HVar20 + 8) + uVar21 * 0x10) == 7) &&
         (iVar12 = bcmp(*(void **)(uVar21 * 0x10 + (long)HVar20),"grault",7),
         HVar20 = (HashBucket)local_588._24_8_, iVar12 == 0)) goto LAB_0015a086;
    }
  }
  uVar21 = (ulong)uVar18 + 1;
  uVar18 = (uint)uVar21;
  if (uVar21 == sVar17) {
    uVar18 = 0;
  }
  goto LAB_00159523;
LAB_0015a086:
  bVar22 = true;
LAB_001595bd:
  pTVar16 = local_3c0;
  if (!bVar22) {
    auStack_560._0_8_ = &local_5e0;
    local_5e0 = (HashBucket)((ulong)local_5e0 & 0xffffffffffffff00);
    local_568[0] = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>)
                   0x1;
    auStack_560._8_8_ = &local_5d8;
    auStack_560._16_8_ = local_588;
    local_548 = "grault";
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
              ((Fault *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa1,FAILED,(char *)0x0,"\"shouldn\'t have called this\"",
               (char (*) [27])"shouldn\'t have called this");
    Debug::Fault::fatal((Fault *)local_1d8);
  }
  local_378._0_8_ = uVar21 * 0x10 + (long)local_5d8.rows.builder.ptr;
  local_378._8_8_ = local_3c0;
  local_378._16_8_ = " == ";
  local_378._24_8_ = &DAT_00000005;
  local_378[0x20] =
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
       local_378._0_8_ == local_3c0;
  if ((!local_378[0x20]) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[135],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa1,ERROR,
               "\"failed: expected \" \"&table.findOrCreate(\\\"grault\\\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\\\"shouldn\'t have called this\\\"); }) == &graultRow\", _kjCondition"
               ,(char (*) [135])
                "failed: expected &table.findOrCreate(\"grault\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\"shouldn\'t have called this\"); }) == &graultRow"
               ,(DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_378);
  }
  local_568 = *(undefined1 (*) [8])&pTVar16->field_0x0;
  auStack_560._0_8_ = local_3c8;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  bVar22 = local_568 == (undefined1  [8])local_3c8;
  local_548._0_1_ = bVar22;
  if ((!bVar22) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<char_const*,char_const*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa2,ERROR,
               "\"failed: expected \" \"graultRow.begin() == origGrault.begin()\", _kjCondition",
               (char (*) [57])"failed: expected graultRow.begin() == origGrault.begin()",
               (DebugComparison<const_char_*,_const_char_*> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  if ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
      local_378._0_8_ ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)0x0) {
    local_1d8[0].content.ptr = (char *)0x0;
    local_378._0_8_ = (StringPtr *)0x0;
    local_378._8_8_ = (StringPtr *)0x0;
    Debug::Fault::init((Fault *)local_1d8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                      );
    Debug::Fault::fatal((Fault *)local_1d8);
  }
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = pTVar16;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548._0_1_ =
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
       local_378._0_8_ == pTVar16;
  if ((!(bool)local_548._0_1_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[72],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa3,ERROR,
               "\"failed: expected \" \"&KJ_ASSERT_NONNULL(table.find(\\\"grault\\\")) == &graultRow\", _kjCondition"
               ,(char (*) [72])
                "failed: expected &KJ_ASSERT_NONNULL(table.find(\"grault\")) == &graultRow",
               (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_568);
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             local_378,(char (*) [7])&local_5d8);
  local_568 = (undefined1  [8])local_378._0_8_;
  auStack_560._0_8_ = &none;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548._0_1_ =
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
       local_378._0_8_ ==
       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)0x0;
  params_00 = extraout_RDX_00;
  if ((!(bool)local_548._0_1_) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa4,ERROR,
               "\"failed: expected \" \"table.find(\\\"waldo\\\") == kj::none\", _kjCondition",
               (char (*) [49])"failed: expected table.find(\"waldo\") == kj::none",
               (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_568);
    params_00 = extraout_RDX_01;
  }
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_568 = (undefined1  [8])(lVar13 >> 4);
  auStack_560._0_4_ = 4;
  auStack_560._8_8_ = " == ";
  auStack_560._16_8_ = &DAT_00000005;
  local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x40);
  if ((lVar13 != 0x40) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
               ,(char  [7])0xa5,ERROR,"\"failed: expected \" \"table.size() == 4\", _kjCondition",
               (char (*) [35])"failed: expected table.size() == 4",
               (DebugComparison<unsigned_long,_int>_conflict *)local_568);
    params_00 = extraout_RDX_02;
  }
  str<char_const(&)[6]>((String *)local_378,(kj *)0x1e16ee,params_00);
  str<char_const(&)[6]>(local_1d8,(kj *)0x1e16ee,params_01);
  local_588._24_8_ = local_5d8.rows.builder.ptr;
  lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
  local_588._0_8_ = lVar13 >> 4;
  if (local_5d8.indexes.buckets.size_ * 2 <
      (local_5d8.indexes.erasedCount + local_588._0_8_) * 3 + 3) {
    HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash
              (&local_5d8.indexes,local_588._0_8_ * 3 + 3);
  }
  pTVar16 = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
            local_378._0_8_;
  if ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
      local_378._8_8_ ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)0x0) {
    pTVar16 = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
              0x1f73e6;
  }
  s_00.size_ = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
               (local_378._8_8_ +
               ((ulong)((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                         *)local_378._8_8_ ==
                       (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                        *)0x0) - 1));
  s_00.ptr = (uchar *)pTVar16;
  uVar11 = HashCoder::operator*((HashCoder *)&HASHCODER,s_00);
  sVar17 = local_5d8.indexes.buckets.size_;
  pHVar6 = local_5d8.indexes.buckets.ptr;
  pTVar16 = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
            (local_378._8_8_ + 0x68 +
            ((ulong)((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)local_378._8_8_ ==
                    (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                     *)0x0) - 0x68));
  local_3c8 = (Exception *)local_378._0_8_;
  if ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
      local_378._8_8_ ==
      (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)0x0) {
    local_3c8 = (Exception *)
                (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
                0x1f73e6;
  }
  pHVar19 = (HashBucket *)0x0;
  HVar20 = (HashBucket)local_588._24_8_;
  uVar18 = (int)local_5d8.indexes.buckets.size_ - 1U & uVar11;
  local_3c0 = pTVar16;
  local_3b8 = lVar13;
  do {
    pHVar15 = pHVar6 + uVar18;
    uVar1 = pHVar15->value;
    uVar21 = (ulong)uVar1;
    if (uVar1 == 1) {
      if (pHVar19 == (HashBucket *)0x0) {
        pHVar19 = pHVar15;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar19 != (HashBucket *)0x0) {
          local_5d8.indexes.erasedCount = local_5d8.indexes.erasedCount - 1;
          pHVar15 = pHVar19;
        }
        *pHVar15 = (HashBucket)((ulong)uVar11 + local_3b8 * 0x10000000 + 0x200000000);
        bVar22 = false;
        goto LAB_001599ee;
      }
      if (pHVar15->hash == uVar11) {
        uVar21 = (ulong)(uVar1 - 2);
        if (((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             *(size_t *)
              ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
               ((long)HVar20 + 8) + uVar21 * 0x10) == pTVar16) &&
           (iVar12 = bcmp(*(void **)(uVar21 * 0x10 + (long)HVar20),local_3c8,
                          *(size_t *)
                           ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                             *)((long)HVar20 + 8) + uVar21 * 0x10)),
           HVar20 = (HashBucket)local_588._24_8_, pTVar16 = local_3c0, iVar12 == 0)) {
          bVar22 = true;
LAB_001599ee:
          if (bVar22) {
            HVar20 = (HashBucket)(uVar21 * 0x10 + (long)local_5d8.rows.builder.ptr);
          }
          else {
            auStack_560._0_8_ = &local_5e0;
            local_5e0 = (HashBucket)((ulong)local_5e0 & 0xffffffffffffff00);
            local_568[0] = (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                            )0x1;
            auStack_560._8_8_ = &local_5d8;
            auStack_560._16_8_ = local_588;
            local_548 = local_378;
            pEVar14 = (Exception *)local_1d8[0].content.ptr;
            if ((Exception *)local_1d8[0].content.size_ == (Exception *)0x0) {
              pEVar14 = (Exception *)0x1f73e6;
            }
            bVar22 = (Exception *)local_1d8[0].content.size_ == (Exception *)0x0;
            ppvVar2 = (void **)(local_1d8[0].content.size_ + 0x68);
            if (local_5d8.rows.builder.pos == local_5d8.rows.builder.endPtr) {
              sVar17 = 4;
              if (local_5d8.rows.builder.endPtr != local_5d8.rows.builder.ptr) {
                sVar17 = (long)local_5d8.rows.builder.endPtr - (long)local_5d8.rows.builder.ptr >> 3
                ;
              }
              Vector<kj::StringPtr>::setCapacity(&local_5d8.rows,sVar17);
            }
            HVar20 = (HashBucket)local_5d8.rows.builder.pos;
            *(Exception **)local_5d8.rows.builder.pos = pEVar14;
            *(ulong *)((long)local_5d8.rows.builder.pos + 8) =
                 (long)ppvVar2 + ((ulong)bVar22 - 0x68);
            local_5d8.rows.builder.pos =
                 (RemoveConst<kj::StringPtr> *)((long)local_5d8.rows.builder.pos + 0x10);
            local_5e0.hash._0_1_ = 1;
            Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
            ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                         *)local_568);
          }
          local_588._0_8_ = HVar20;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)local_588,(char (*) [7])0x1e16ee);
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xac,ERROR,
                       "\"failed: expected \" \"waldo == \\\"waldo\\\"\", _kjCondition",
                       (char (*) [34])"failed: expected waldo == \"waldo\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568);
          }
          local_568 = *(undefined1 (*) [8])HVar20;
          auStack_560._0_8_ = local_1d8[0].content.size_;
          if ((Exception *)local_1d8[0].content.size_ != (Exception *)0x0) {
            auStack_560._0_8_ = local_1d8[0].content.ptr;
          }
          auStack_560._8_8_ = " == ";
          auStack_560._16_8_ = &DAT_00000005;
          local_548 = (char *)CONCAT71(local_548._1_7_,
                                       local_568 == (undefined1  [8])auStack_560._0_8_);
          if ((local_568 != (undefined1  [8])auStack_560._0_8_) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[54],kj::_::DebugComparison<char_const*,char*>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xad,ERROR,
                       "\"failed: expected \" \"waldo.begin() == insertWaldo.begin()\", _kjCondition"
                       ,(char (*) [54])"failed: expected waldo.begin() == insertWaldo.begin()",
                       (DebugComparison<const_char_*,_char_*> *)local_568);
          }
          Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
          find<0ul,char_const(&)[7]>
                    ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)local_588,(char (*) [7])&local_5d8);
          if ((HashBucket)local_588._0_8_ == (HashBucket)0x0) {
            local_3b0.exception = (Exception *)0x0;
            local_588._0_8_ = (_func_int **)0x0;
            local_588._8_8_ = 0;
            Debug::Fault::init(&local_3b0,
                               (EVP_PKEY_CTX *)
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                              );
            Debug::Fault::fatal(&local_3b0);
          }
          local_5e0.hash = local_588._0_4_;
          local_5e0.value = local_588._4_4_;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)&local_5e0,(char (*) [7])"grault");
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xae,ERROR,
                       "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"grault\\\")) == \\\"grault\\\"\", _kjCondition"
                       ,(char (*) [69])
                        "failed: expected KJ_ASSERT_NONNULL(table.find(\"grault\")) == \"grault\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568);
          }
          Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
          find<0ul,char_const(&)[6]>
                    ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                      *)local_588,(char (*) [7])&local_5d8);
          if ((HashBucket)local_588._0_8_ == (HashBucket)0x0) {
            local_5e0.hash = 0;
            local_5e0.value = 0;
            local_588._0_8_ = (_func_int **)0x0;
            local_588._8_8_ = 0;
            Debug::Fault::init((Fault *)&local_5e0,
                               (EVP_PKEY_CTX *)
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                              );
            Debug::Fault::fatal((Fault *)&local_5e0);
          }
          local_568 = (undefined1  [8])local_588._0_8_;
          auStack_560._8_8_ = " == ";
          auStack_560._16_8_ = &DAT_00000005;
          auStack_560._0_8_ = HVar20;
          if (((HashBucket)local_588._0_8_ != HVar20) && (Debug::minSeverity < 3)) {
            local_548._0_1_ = (HashBucket)local_588._0_8_ == HVar20;
            Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xaf,ERROR,
                       "\"failed: expected \" \"&KJ_ASSERT_NONNULL(table.find(\\\"waldo\\\")) == &waldo\", _kjCondition"
                       ,(char (*) [67])
                        "failed: expected &KJ_ASSERT_NONNULL(table.find(\"waldo\")) == &waldo",
                       (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_568);
          }
          lVar13 = (long)local_5d8.rows.builder.pos - (long)local_5d8.rows.builder.ptr;
          local_568 = (undefined1  [8])(lVar13 >> 4);
          auStack_560._0_4_ = 5;
          auStack_560._8_8_ = " == ";
          auStack_560._16_8_ = &DAT_00000005;
          local_548 = (char *)CONCAT71(local_548._1_7_,lVar13 == 0x50);
          if ((lVar13 != 0x50) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb0,ERROR,
                       "\"failed: expected \" \"table.size() == 5\", _kjCondition",
                       (char (*) [35])"failed: expected table.size() == 5",
                       (DebugComparison<unsigned_long,_int>_conflict *)local_568);
          }
          local_588._0_8_ = (long)local_5d8.rows.builder.ptr + 0x10;
          local_5e0 = (HashBucket)local_5d8.rows.builder.ptr;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)&local_5e0,(char (*) [7])"garply");
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb4,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"garply\\\"\", _kjCondition",
                       (char (*) [37])"failed: expected *iter++ == \"garply\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568);
          }
          local_5e0.hash = local_588._0_4_;
          local_5e0.value = local_588._4_4_;
          local_588._0_8_ = local_588._0_8_ + 0x10;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)&local_5e0,(char (*) [7])"grault");
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb5,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"grault\\\"\", _kjCondition",
                       (char (*) [37])"failed: expected *iter++ == \"grault\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_568);
          }
          local_5e0.hash = local_588._0_4_;
          local_5e0.value = local_588._4_4_;
          local_588._0_8_ = local_588._0_8_ + 0x10;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)&local_5e0,(char (*) [7])"qux");
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb6,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"qux\\\"\", _kjCondition",
                       (char (*) [34])"failed: expected *iter++ == \"qux\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_568);
          }
          local_5e0.hash = local_588._0_4_;
          local_5e0.value = local_588._4_4_;
          local_588._0_8_ = local_588._0_8_ + 0x10;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)&local_5e0,(char (*) [7])"corge");
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb7,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"corge\\\"\", _kjCondition",
                       (char (*) [36])"failed: expected *iter++ == \"corge\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568);
          }
          local_5e0.hash = local_588._0_4_;
          local_5e0.value = local_588._4_4_;
          local_588._0_8_ = local_588._0_8_ + 0x10;
          DebugExpression<kj::StringPtr&>::operator==
                    ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568,
                     (DebugExpression<kj::StringPtr&> *)&local_5e0,(char (*) [7])0x1e16ee);
          if (((bool)local_548._0_1_ == false) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb8,ERROR,
                       "\"failed: expected \" \"*iter++ == \\\"waldo\\\"\", _kjCondition",
                       (char (*) [36])"failed: expected *iter++ == \"waldo\"",
                       (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_568);
          }
          auStack_560._0_8_ = local_5d8.rows.builder.pos;
          auStack_560._8_8_ = " == ";
          auStack_560._16_8_ = &DAT_00000005;
          local_548 = (char *)CONCAT71(local_548._1_7_,
                                       (RemoveConst<kj::StringPtr> *)local_588._0_8_ ==
                                       local_5d8.rows.builder.pos);
          local_568 = (undefined1  [8])local_588;
          if (((RemoveConst<kj::StringPtr> *)local_588._0_8_ != local_5d8.rows.builder.pos) &&
             (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                       ,(char  [7])0xb9,ERROR,
                       "\"failed: expected \" \"iter == table.end()\", _kjCondition",
                       (char (*) [37])"failed: expected iter == table.end()",
                       (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_568);
          }
          sVar17 = local_1d8[0].content.size_;
          pcVar10 = local_1d8[0].content.ptr;
          if ((Exception *)local_1d8[0].content.ptr != (Exception *)0x0) {
            local_1d8[0].content.ptr = (char *)0x0;
            local_1d8[0].content.size_ = 0;
            (**(local_1d8[0].content.disposer)->_vptr_ArrayDisposer)
                      (local_1d8[0].content.disposer,pcVar10,1,sVar17,sVar17,0);
          }
          uVar9 = local_378._8_8_;
          uVar8 = local_378._0_8_;
          if ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
              local_378._0_8_ !=
              (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)0x0)
          {
            local_378._0_8_ =
                 (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
                 0x0;
            local_378._8_8_ =
                 (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
                 0x0;
            (***(_func_int ***)local_378._16_8_)(local_378._16_8_,uVar8,1,uVar9,uVar9,0);
          }
          sVar17 = local_5d8.indexes.buckets.size_;
          pHVar6 = local_5d8.indexes.buckets.ptr;
          if (local_5d8.indexes.buckets.ptr != (HashBucket *)0x0) {
            local_5d8.indexes.buckets.ptr = (HashBucket *)0x0;
            local_5d8.indexes.buckets.size_ = 0;
            (**(local_5d8.indexes.buckets.disposer)->_vptr_ArrayDisposer)
                      (local_5d8.indexes.buckets.disposer,pHVar6,8,sVar17,sVar17,0);
          }
          pSVar5 = local_5d8.rows.builder.endPtr;
          pRVar4 = local_5d8.rows.builder.pos;
          pSVar3 = local_5d8.rows.builder.ptr;
          if ((HashBucket)local_5d8.rows.builder.ptr != (HashBucket)0x0) {
            local_5d8.rows.builder.ptr = (StringPtr *)0x0;
            local_5d8.rows.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
            local_5d8.rows.builder.endPtr = (StringPtr *)0x0;
            (**(local_5d8.rows.builder.disposer)->_vptr_ArrayDisposer)
                      (local_5d8.rows.builder.disposer,pSVar3,0x10,(long)pRVar4 - (long)pSVar3 >> 4,
                       (long)pSVar5 - (long)pSVar3 >> 4,0);
          }
          return;
        }
      }
    }
    uVar21 = (ulong)uVar18 + 1;
    uVar18 = (uint)uVar21;
    if (uVar21 == sVar17) {
      uVar18 = 0;
    }
  } while( true );
}

Assistant:

TEST(Exception, RunCatchingExceptionsOtherException) {
  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    throw 123;
  });

  KJ_IF_SOME(ex, e) {
#if __GNUC__ && !KJ_NO_RTTI
    EXPECT_EQ("unknown non-KJ exception of type: int", ex.getDescription());
#else
    EXPECT_EQ("unknown non-KJ exception", ex.getDescription());
#endif
  } else {
    ADD_FAILURE() << "Expected exception";
  }